

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::StandardNumericToDecimalCast<int,long,duckdb::SignedToDecimalOperator>
               (int input,long *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  long lVar4;
  long lVar5;
  undefined7 in_register_00000081;
  uchar in_R9B;
  string error;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  uVar3 = CONCAT71(in_register_00000081,scale) & 0xffffffff;
  lVar1 = *(long *)(NumericHelper::POWERS_OF_TEN +
                   ((CONCAT71(in_register_00000009,width) & 0xffffffff) - uVar3) * 8);
  lVar4 = (long)input;
  lVar5 = -lVar1;
  bVar2 = SBORROW8(lVar4,lVar5) == lVar4 + lVar1 < 0;
  if ((lVar4 != lVar5 && bVar2) && lVar4 < lVar1) {
    *result = lVar4 * *(long *)(NumericHelper::POWERS_OF_TEN + uVar3 * 8);
  }
  else {
    local_70[0] = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Could not cast value %d to DECIMAL(%d,%d)","");
    Exception::ConstructMessage<int,unsigned_char,unsigned_char>
              (&local_50,(Exception *)local_70,(string *)(ulong)(uint)input,(uint)width,scale,in_R9B
              );
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    HandleCastError::AssignError(&local_50,parameters);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return (lVar4 != lVar5 && bVar2) && lVar4 < lVar1;
}

Assistant:

bool StandardNumericToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	DST max_width = UnsafeNumericCast<DST>(NumericHelper::POWERS_OF_TEN[width - scale]);
	if (OP::template Operation<SRC, DST>(input, max_width)) {
		string error = StringUtil::Format("Could not cast value %d to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = UnsafeNumericCast<DST>(DST(input) * NumericHelper::POWERS_OF_TEN[scale]);
	return true;
}